

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall spv::Builder::If::makeEndIf(If *this)

{
  If *this_local;
  
  createBranch(this->builder,true,this->mergeBlock);
  setBuildPoint(this->builder,this->headerBlock);
  if (this->elseBlock == (Block *)0x0) {
    createConditionalBranch(this->builder,this->condition,this->thenBlock,this->mergeBlock);
  }
  else {
    createConditionalBranch(this->builder,this->condition,this->thenBlock,this->elseBlock);
  }
  spv::Function::addBlock(this->function,this->mergeBlock);
  setBuildPoint(this->builder,this->mergeBlock);
  return;
}

Assistant:

void Builder::If::makeEndIf()
{
    // jump to the merge block
    builder.createBranch(true, mergeBlock);

    // Go back to the headerBlock and make the flow control split
    builder.setBuildPoint(headerBlock);
    if (elseBlock)
        builder.createConditionalBranch(condition, thenBlock, elseBlock);
    else
        builder.createConditionalBranch(condition, thenBlock, mergeBlock);

    // add the merge block to the function
    function->addBlock(mergeBlock);
    builder.setBuildPoint(mergeBlock);
}